

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string_t * __thiscall
el::base::DefaultLogBuilder::build_abi_cxx11_
          (DefaultLogBuilder *this,LogMessage *logMessage,bool appendNewLine)

{
  undefined *puVar1;
  char *pcVar2;
  bool bVar3;
  Level LVar4;
  Logger *pLVar5;
  string_t *psVar6;
  element_type *peVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  pointer pCVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  byte in_CL;
  LogMessage *in_RDX;
  string_t *in_RDI;
  string_t wcsFormatSpecifier;
  string fs;
  const_iterator it;
  ScopedLock lock_;
  char *buf_2;
  char *buf_1;
  char *buf;
  char *bufLim;
  char buff [110];
  LogFormat *logFormat;
  TypedConfigurations *tc;
  string_t *logLine;
  undefined4 in_stack_fffffffffffff9c8;
  Level in_stack_fffffffffffff9cc;
  TypedConfigurations *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  char *in_stack_fffffffffffff9e0;
  undefined1 zeroPadded;
  LogMessage *__args;
  char *in_stack_fffffffffffff9e8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_el::LogMessage_*)>
  *this_01;
  string_t *in_stack_fffffffffffff9f0;
  string_t *in_stack_fffffffffffff9f8;
  string_t *in_stack_fffffffffffffa00;
  Storage *in_stack_fffffffffffffa08;
  string local_428 [39];
  undefined1 local_401 [56];
  undefined1 local_3c9 [33];
  CustomFormatSpecifier *local_3a8;
  __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  local_3a0;
  NoScopedLock<el::base::threading::internal::NoMutex> local_398;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  char *local_318;
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  char *local_2c0;
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  char *local_268;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [32];
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [48];
  char *local_b0;
  char local_a8 [119];
  byte local_31;
  LogFormat *local_30;
  TypedConfigurations *local_28;
  byte local_19;
  LogMessage *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  pLVar5 = LogMessage::logger(in_RDX);
  local_28 = Logger::typedConfigurations(pLVar5);
  LogMessage::level(local_18);
  local_30 = TypedConfigurations::logFormat(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  local_31 = 0;
  psVar6 = LogFormat::format_abi_cxx11_(local_30);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar6);
  local_a8[0x60] = '\0';
  local_a8[0x61] = '\0';
  local_a8[0x62] = '\0';
  local_a8[99] = '\0';
  local_a8[100] = '\0';
  local_a8[0x65] = '\0';
  local_a8[0x66] = '\0';
  local_a8[0x67] = '\0';
  local_a8[0x68] = '\0';
  local_a8[0x69] = '\0';
  local_a8[0x6a] = '\0';
  local_a8[0x6b] = '\0';
  local_a8[0x6c] = '\0';
  local_a8[0x6d] = '\0';
  local_a8[0x50] = '\0';
  local_a8[0x51] = '\0';
  local_a8[0x52] = '\0';
  local_a8[0x53] = '\0';
  local_a8[0x54] = '\0';
  local_a8[0x55] = '\0';
  local_a8[0x56] = '\0';
  local_a8[0x57] = '\0';
  local_a8[0x58] = '\0';
  local_a8[0x59] = '\0';
  local_a8[0x5a] = '\0';
  local_a8[0x5b] = '\0';
  local_a8[0x5c] = '\0';
  local_a8[0x5d] = '\0';
  local_a8[0x5e] = '\0';
  local_a8[0x5f] = '\0';
  local_a8[0x40] = '\0';
  local_a8[0x41] = '\0';
  local_a8[0x42] = '\0';
  local_a8[0x43] = '\0';
  local_a8[0x44] = '\0';
  local_a8[0x45] = '\0';
  local_a8[0x46] = '\0';
  local_a8[0x47] = '\0';
  local_a8[0x48] = '\0';
  local_a8[0x49] = '\0';
  local_a8[0x4a] = '\0';
  local_a8[0x4b] = '\0';
  local_a8[0x4c] = '\0';
  local_a8[0x4d] = '\0';
  local_a8[0x4e] = '\0';
  local_a8[0x4f] = '\0';
  local_a8[0x30] = '\0';
  local_a8[0x31] = '\0';
  local_a8[0x32] = '\0';
  local_a8[0x33] = '\0';
  local_a8[0x34] = '\0';
  local_a8[0x35] = '\0';
  local_a8[0x36] = '\0';
  local_a8[0x37] = '\0';
  local_a8[0x38] = '\0';
  local_a8[0x39] = '\0';
  local_a8[0x3a] = '\0';
  local_a8[0x3b] = '\0';
  local_a8[0x3c] = '\0';
  local_a8[0x3d] = '\0';
  local_a8[0x3e] = '\0';
  local_a8[0x3f] = '\0';
  local_a8[0x20] = '\0';
  local_a8[0x21] = '\0';
  local_a8[0x22] = '\0';
  local_a8[0x23] = '\0';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = '\0';
  local_a8[0x27] = '\0';
  local_a8[0x28] = '\0';
  local_a8[0x29] = '\0';
  local_a8[0x2a] = '\0';
  local_a8[0x2b] = '\0';
  local_a8[0x2c] = '\0';
  local_a8[0x2d] = '\0';
  local_a8[0x2e] = '\0';
  local_a8[0x2f] = '\0';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_b0 = local_a8 + 0x6e;
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  puVar1 = consts::kAppNameFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,puVar1,&local_e1);
    pLVar5 = LogMessage::logger(local_18);
    Logger::parentApplicationName_abi_cxx11_(pLVar5);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  puVar1 = consts::kThreadIdFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,puVar1,&local_109);
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x271d71);
    threading::getCurrentThreadId_abi_cxx11_();
    Storage::getThreadName(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  puVar1 = consts::kDateTimeFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,puVar1,&local_171);
    LogFormat::dateTimeFormat_abi_cxx11_(local_30);
    std::__cxx11::string::c_str();
    LogMessage::level(local_18);
    TypedConfigurations::subsecondPrecision(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
    utils::DateTime::getDateTime_abi_cxx11_
              ((char *)in_stack_fffffffffffff9f8,(SubsecondPrecision *)in_stack_fffffffffffff9f0);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  puVar1 = consts::kLogFunctionFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,puVar1,&local_1b9);
    LogMessage::func_abi_cxx11_(local_18);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  if (bVar3) {
    utils::Str::clearBuff
              ((char *)in_stack_fffffffffffff9d0,
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    LogMessage::file_abi_cxx11_(local_18);
    std::__cxx11::string::c_str();
    utils::File::buildStrippedFilename
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,(size_t)in_stack_fffffffffffff9d0
              );
    puVar1 = consts::kLogFileFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,puVar1,&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,local_a8,&local_209);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  if (bVar3) {
    utils::Str::clearBuff
              ((char *)in_stack_fffffffffffff9d0,
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    LogMessage::file_abi_cxx11_(local_18);
    utils::File::buildBaseFilename
              (in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,
               (size_t)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    puVar1 = consts::kLogFileBaseFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,puVar1,&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,local_a8,&local_259);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  if (bVar3) {
    local_268 = utils::Str::clearBuff
                          ((char *)in_stack_fffffffffffff9d0,
                           CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    LogMessage::line(local_18);
    local_268 = utils::Str::convertAndAddToBuff
                          ((size_t)in_stack_fffffffffffffa00,
                           (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                           (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                           SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
    puVar1 = consts::kLogLineFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,puVar1,&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b0,local_a8,&local_2b1);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  if (bVar3) {
    local_2c0 = utils::Str::clearBuff
                          ((char *)in_stack_fffffffffffff9d0,
                           CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    LogMessage::file_abi_cxx11_(local_18);
    std::__cxx11::string::c_str();
    utils::File::buildStrippedFilename
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,(size_t)in_stack_fffffffffffff9d0
              );
    local_2c0 = utils::Str::addToBuff(local_a8,local_2c0,local_b0);
    local_2c0 = utils::Str::addToBuff(":",local_2c0,local_b0);
    LogMessage::line(local_18);
    local_2c0 = utils::Str::convertAndAddToBuff
                          ((size_t)in_stack_fffffffffffffa00,
                           (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                           (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                           SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x38,0));
    puVar1 = consts::kLogLocationFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,puVar1,&local_2e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,local_a8,&local_309);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  }
  zeroPadded = (undefined1)((ulong)in_stack_fffffffffffff9e0 >> 0x38);
  LVar4 = LogMessage::level(local_18);
  if ((LVar4 == Verbose) &&
     (bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc),
     bVar3)) {
    local_318 = utils::Str::clearBuff
                          ((char *)in_stack_fffffffffffff9d0,
                           CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    LogMessage::verboseLevel(local_18);
    local_318 = utils::Str::convertAndAddToBuff
                          ((size_t)in_stack_fffffffffffffa00,
                           (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                           (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                           (bool)zeroPadded);
    puVar1 = consts::kVerboseLevelFormatSpecifier;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_338,puVar1,&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,local_a8,&local_361);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
  }
  bVar3 = LogFormat::hasFlag((LogFormat *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
  pcVar2 = consts::kMessageFormatSpecifier;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,pcVar2,&local_389);
    LogMessage::message_abi_cxx11_(local_18);
    utils::Str::replaceFirstWithEscape
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
  }
  peVar7 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x272bfd);
  (*(peVar7->super_ThreadSafe)._vptr_ThreadSafe[2])();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)in_stack_fffffffffffff9d0,
             (NoMutex *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  peVar7 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x272c30);
  __beg._M_current = (char *)Storage::customFormatSpecifiers(peVar7);
  local_3a0._M_current =
       (CustomFormatSpecifier *)
       utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::
       begin((vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_> *)
             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
  while( true ) {
    peVar7 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x272c5d);
    __end._M_current = (char *)Storage::customFormatSpecifiers(peVar7);
    local_3a8 = (CustomFormatSpecifier *)
                utils::std::
                vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::end
                          ((vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>
                            *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                        *)in_stack_fffffffffffff9d0,
                       (__normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    if (!bVar3) break;
    pCVar8 = __gnu_cxx::
             __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
             ::operator->(&local_3a0);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CustomFormatSpecifier::formatSpecifier(pCVar8);
    this_01 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_el::LogMessage_*)>
               *)local_3c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_3c9 + 1),(char *)this_00,(allocator *)this_01);
    std::allocator<char>::~allocator((allocator<char> *)local_3c9);
    local_401._9_8_ = std::__cxx11::string::begin();
    local_401._1_8_ = std::__cxx11::string::end();
    __args = (LogMessage *)local_401;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_00,__beg,__end,(allocator<char> *)this_01);
    std::allocator<char>::~allocator((allocator<char> *)local_401);
    pCVar8 = __gnu_cxx::
             __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
             ::operator->(&local_3a0);
    in_stack_fffffffffffff9d0 =
         (TypedConfigurations *)CustomFormatSpecifier::resolver_abi_cxx11_(pCVar8);
    utils::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_el::LogMessage_*)>
    ::operator()(this_01,__args);
    utils::Str::replaceFirstWithEscape
              ((string_t *)__beg._M_current,(string_t *)__end._M_current,this_00);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string((string *)(local_401 + 0x11));
    std::__cxx11::string::~string((string *)(local_3c9 + 1));
    __gnu_cxx::
    __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
    ::operator++(&local_3a0);
  }
  if ((local_19 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,"\n");
  }
  local_31 = 1;
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_398);
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

base::type::string_t DefaultLogBuilder::build(const LogMessage* logMessage, bool appendNewLine) const {
  base::TypedConfigurations* tc = logMessage->logger()->typedConfigurations();
  const base::LogFormat* logFormat = &tc->logFormat(logMessage->level());
  base::type::string_t logLine = logFormat->format();
  char buff[base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength] = "";
  const char* bufLim = buff + sizeof(buff);
  if (logFormat->hasFlag(base::FormatFlags::AppName)) {
    // App name
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kAppNameFormatSpecifier,
        logMessage->logger()->parentApplicationName());
  }
  if (logFormat->hasFlag(base::FormatFlags::ThreadId)) {
    // Thread ID
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kThreadIdFormatSpecifier,
        ELPP->getThreadName(base::threading::getCurrentThreadId()));
  }
  if (logFormat->hasFlag(base::FormatFlags::DateTime)) {
    // DateTime
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kDateTimeFormatSpecifier,
        base::utils::DateTime::getDateTime(logFormat->dateTimeFormat().c_str(),
                                           &tc->subsecondPrecision(logMessage->level())));
  }
  if (logFormat->hasFlag(base::FormatFlags::Function)) {
    // Function
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFunctionFormatSpecifier, logMessage->func());
  }
  if (logFormat->hasFlag(base::FormatFlags::File)) {
    // File
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::FileBase)) {
    // FileBase
    base::utils::Str::clearBuff(buff, base::consts::kSourceFilenameMaxLength);
    base::utils::File::buildBaseFilename(logMessage->file(), buff);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogFileBaseFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Line)) {
    // Line
    char* buf = base::utils::Str::clearBuff(buff, base::consts::kSourceLineMaxLength);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(), base::consts::kSourceLineMaxLength, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLineFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::Location)) {
    // Location
    char* buf = base::utils::Str::clearBuff(buff,
                                            base::consts::kSourceFilenameMaxLength + base::consts::kSourceLineMaxLength);
    base::utils::File::buildStrippedFilename(logMessage->file().c_str(), buff);
    buf = base::utils::Str::addToBuff(buff, buf, bufLim);
    buf = base::utils::Str::addToBuff(":", buf, bufLim);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->line(),  base::consts::kSourceLineMaxLength, buf, bufLim,
          false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kLogLocationFormatSpecifier, std::string(buff));
  }
  if (logMessage->level() == Level::Verbose && logFormat->hasFlag(base::FormatFlags::VerboseLevel)) {
    // Verbose level
    char* buf = base::utils::Str::clearBuff(buff, 1);
    buf = base::utils::Str::convertAndAddToBuff(logMessage->verboseLevel(), 1, buf, bufLim, false);
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kVerboseLevelFormatSpecifier, std::string(buff));
  }
  if (logFormat->hasFlag(base::FormatFlags::LogMessage)) {
    // Log message
    base::utils::Str::replaceFirstWithEscape(logLine, base::consts::kMessageFormatSpecifier, logMessage->message());
  }
#if !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  el::base::threading::ScopedLock lock_(ELPP->lock());
  ELPP_UNUSED(lock_);
  for (std::vector<CustomFormatSpecifier>::const_iterator it = ELPP->customFormatSpecifiers()->begin();
       it != ELPP->customFormatSpecifiers()->end(); ++it) {
    std::string fs(it->formatSpecifier());
    base::type::string_t wcsFormatSpecifier(fs.begin(), fs.end());
    base::utils::Str::replaceFirstWithEscape(logLine, wcsFormatSpecifier, it->resolver()(logMessage));
  }
#endif  // !defined(ELPP_DISABLE_CUSTOM_FORMAT_SPECIFIERS)
  if (appendNewLine) logLine += ELPP_LITERAL("\n");
  return logLine;
}